

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_bindings.cpp
# Opt level: O1

void __thiscall PyClientSession::send_packet_data(PyClientSession *this,char *data,size_t size)

{
  function overload;
  object o;
  gil_scoped_acquire gil;
  handle local_40;
  object local_38;
  size_t local_30;
  object local_28;
  gil_scoped_acquire local_20;
  
  local_30 = size;
  pybind11::gil_scoped_acquire::gil_scoped_acquire(&local_20);
  pybind11::get_overload<ki::protocol::net::ClientSession>
            ((pybind11 *)&local_40,&this->super_ClientSession,"send_packet_data");
  if (local_40.m_ptr == (PyObject *)0x0) {
    pybind11::object::~object((object *)&local_40);
    pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_20);
  }
  else {
    pybind11::bytes::bytes((bytes *)&local_38,data,local_30);
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_28,(bytes *)&local_40,
               (unsigned_long *)&local_38);
    pybind11::object::~object(&local_38);
    pybind11::object::~object(&local_28);
    pybind11::object::~object((object *)&local_40);
    pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_20);
    if (local_40.m_ptr != (PyObject *)0x0) {
      return;
    }
  }
  pybind11::pybind11_fail
            (
            "Tried to call pure virtual function \"ki::protocol::net::ClientSession::send_packet_data\""
            );
}

Assistant:

void send_packet_data(const char *data, const size_t size) override
    {
        PYBIND11_OVERLOAD_PURE(
            void, ki::protocol::net::ClientSession,
            send_packet_data, py::bytes(data, size), size);
    }